

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  ImFontAtlas *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImFontGlyph *pIVar6;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float local_6c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (cfg == (ImFontConfig *)0x0) {
    local_6c = advance_x;
    local_58 = x0;
    uStack_54 = in_XMM0_Db;
    uStack_50 = in_XMM0_Dc;
    uStack_4c = in_XMM0_Dd;
    local_48 = x1;
    uStack_44 = in_XMM2_Db;
    uStack_40 = in_XMM2_Dc;
    uStack_3c = in_XMM2_Dd;
  }
  else {
    auVar3 = vminss_avx(ZEXT416((uint)cfg->GlyphMaxAdvanceX),ZEXT416((uint)advance_x));
    auVar2 = vcmpss_avx(ZEXT416((uint)advance_x),ZEXT416((uint)cfg->GlyphMinAdvanceX),1);
    auVar2 = vblendvps_avx(auVar3,ZEXT416((uint)cfg->GlyphMinAdvanceX),auVar2);
    local_6c = auVar2._0_4_;
    if ((local_6c != advance_x) || (NAN(local_6c) || NAN(advance_x))) {
      fVar7 = (local_6c - advance_x) * 0.5;
      if ((cfg->PixelSnapH & 1U) != 0) {
        auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar7));
        fVar7 = auVar2._0_4_;
      }
      x0 = fVar7 + x0;
      in_XMM0_Db = 0;
      in_XMM0_Dc = 0;
      in_XMM0_Dd = 0;
      x1 = fVar7 + x1;
      in_XMM2_Db = 0;
      in_XMM2_Dc = 0;
      in_XMM2_Dd = 0;
    }
    if ((cfg->PixelSnapH & 1U) != 0) {
      auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(local_6c + 0.5)));
      local_6c = auVar2._0_4_;
    }
    local_6c = local_6c + (cfg->GlyphExtraSpacing).x;
    local_58 = x0;
    uStack_54 = in_XMM0_Db;
    uStack_50 = in_XMM0_Dc;
    uStack_4c = in_XMM0_Dd;
    local_48 = x1;
    uStack_44 = in_XMM2_Db;
    uStack_40 = in_XMM2_Dc;
    uStack_3c = in_XMM2_Dd;
  }
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  pIVar6 = ImVector<ImFontGlyph>::back(&this->Glyphs);
  auVar3._4_4_ = uStack_44;
  auVar3._0_4_ = local_48;
  auVar3._8_4_ = uStack_40;
  auVar3._12_4_ = uStack_3c;
  auVar2._4_4_ = uStack_54;
  auVar2._0_4_ = local_58;
  auVar2._8_4_ = uStack_50;
  auVar2._12_4_ = uStack_4c;
  auVar2 = vcmpps_avx(auVar2,auVar3,4);
  auVar5._4_4_ = in_XMM3_Db;
  auVar5._0_4_ = y1;
  auVar5._8_4_ = in_XMM3_Dc;
  auVar5._12_4_ = in_XMM3_Dd;
  auVar4._4_4_ = in_XMM1_Db;
  auVar4._0_4_ = y0;
  auVar4._8_4_ = in_XMM1_Dc;
  auVar4._12_4_ = in_XMM1_Dd;
  auVar3 = vcmpps_avx(auVar4,auVar5,4);
  auVar2 = vandps_avx(auVar3,auVar2);
  *(uint *)pIVar6 = (uint)codepoint * 4 + (auVar2._0_4_ & 1) * 2;
  pIVar6->X0 = local_58;
  pIVar6->Y0 = y0;
  pIVar6->X1 = local_48;
  pIVar6->Y1 = y1;
  pIVar6->U0 = u0;
  pIVar6->V0 = v0;
  pIVar6->U1 = u1;
  pIVar6->V1 = v1;
  pIVar6->AdvanceX = local_6c;
  pIVar1 = this->ContainerAtlas;
  fVar7 = (float)pIVar1->TexGlyphPadding + 0.99;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((v1 - v0) * (float)pIVar1->TexHeight + fVar7) *
       (int)((u1 - u0) * (float)pIVar1->TexWidth + fVar7);
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}